

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetFunctionContextVariableName(ExpressionContext *ctx,FunctionData *function,uint index)

{
  InplaceStr *pIVar1;
  byte bVar2;
  InplaceStr IVar3;
  int iVar4;
  uint value;
  undefined4 extraout_var;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  char *unaff_R12;
  ulong uVar8;
  char *unaff_R13;
  InplaceStr IVar9;
  InplaceStr IVar10;
  
  pIVar1 = &function->name->name;
  IVar10 = *pIVar1;
  bVar2 = *pIVar1->begin;
  if ((((char)bVar2 < 'A' && bVar2 != 0x24) ||
      ((IVar3 = *pIVar1, bVar2 - 0x5e < 0x21 &&
       (IVar3 = *pIVar1, (0x140000001U >> ((ulong)(bVar2 - 0x5e) & 0x3f) & 1) != 0)))) &&
     (IVar3.end = unaff_R13, IVar3.begin = unaff_R12, IVar9 = GetOperatorName(IVar3), IVar3 = IVar10
     , IVar9.begin != IVar9.end)) {
    IVar3 = IVar9;
  }
  uVar8 = (long)IVar3.end - (long)IVar3.begin;
  uVar7 = (int)uVar8 + 0x21;
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar7);
  IVar10.begin = (char *)CONCAT44(extraout_var,iVar4);
  *IVar10.begin = '$';
  uVar8 = uVar8 & 0xffffffff;
  memcpy(IVar10.begin + 1,IVar3.begin,uVar8);
  IVar10.begin[uVar8 + 1] = '_';
  value = InplaceStr::hash(&(function->type->super_TypeBase).name);
  pcVar5 = NameWriteUnsigned(IVar10.begin + uVar8 + 2,value);
  *pcVar5 = '_';
  pcVar5 = NameWriteUnsigned(pcVar5 + 1,index);
  builtin_strncpy(pcVar5,"_ext",5);
  sVar6 = strlen(IVar10.begin);
  if (uVar7 <= sVar6) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x1b3,
                  "InplaceStr GetFunctionContextVariableName(ExpressionContext &, FunctionData *, unsigned int)"
                 );
  }
  IVar10.end = IVar10.begin + sVar6;
  return IVar10;
}

Assistant:

InplaceStr GetFunctionContextVariableName(ExpressionContext &ctx, FunctionData *function, unsigned index)
{
	InplaceStr functionName = function->name->name;

	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '$';

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, function->type->name.hash());

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, index);

	strcpy(pos, "_ext");
	pos += strlen("_ext");

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}